

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O3

int quote_dname(char *dir)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  char fbuf [256];
  byte local_108 [264];
  
  pbVar2 = local_108;
  pbVar3 = (byte *)dir;
  do {
    bVar1 = *pbVar3;
    lVar4 = 1;
    pbVar5 = pbVar2;
    if (bVar1 < 0x3b) {
      if (bVar1 == 0x27) goto LAB_001374dc;
      if (bVar1 == 0) {
        *pbVar2 = 0;
        if (pbVar2[-1] == 0x2e) {
          pbVar2[-1] = 0x27;
          pbVar2[0] = 0x2e;
        }
        strcpy(dir,(char *)local_108);
        return 1;
      }
    }
    else if ((bVar1 == 0x3e) || (bVar1 == 0x3b)) {
LAB_001374dc:
      *pbVar2 = 0x27;
      lVar4 = 2;
      pbVar5 = pbVar2 + 1;
    }
    pbVar2 = pbVar2 + lVar4;
    *pbVar5 = bVar1;
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

int quote_dname(char *dir)
{
  char *cp, *dp;
  char fbuf[MAXNAMLEN + 1];

  cp = dir;
  dp = fbuf;

  while (*cp) {
    switch (*cp) {
      case '>':
      case ';':
      case '\'':
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

      default: *dp++ = *cp++; break;
    }
  }
  *dp = '\0';

  if (*(dp - 1) == '.') {
    /* Trail period should be quoted. */
    *(dp - 1) = '\'';
    *dp++ = '.';
  }

  strcpy(dir, fbuf);
  return (1);
}